

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O2

void __thiscall wasm::BranchUtils::BranchTargets::Inner::Inner(Inner *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->
  super_PostWalker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  ).
  super_Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  .replacep = (Expression **)0x0;
  (this->
  super_PostWalker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  ).
  super_Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  .stack.usedFixed = 0;
  (this->
  super_PostWalker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  ).
  super_Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_PostWalker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
           ).
           super_Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_PostWalker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
           ).
           super_Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->
  super_PostWalker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  ).
  super_Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  .currFunction = (Function *)0x0;
  (this->
  super_PostWalker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  ).
  super_Walker<wasm::BranchUtils::BranchTargets::Inner,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchTargets::Inner,_void>_>
  .currModule = (Module *)0x0;
  p_Var1 = &(this->targets)._M_t._M_impl.super__Rb_tree_header;
  (this->targets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->targets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->targets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->targets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->targets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->branches)._M_t._M_impl.super__Rb_tree_header;
  (this->branches)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->branches)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->branches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->branches)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->branches)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      operateOnScopeNameDefs(curr, [&](Name name) {
        if (name.is()) {
          targets[name] = curr;
        }
      });
      operateOnScopeNameUses(curr, [&](Name& name) {
        if (name.is()) {
          branches[name].insert(curr);
        }
      });
    }